

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

Frame * rw::countCB(Frame *f,void *count)

{
  Frame *pFVar1;
  
  *(int *)count = *count + 1;
  pFVar1 = Frame::forAllChildren(f,countCB,count);
  return pFVar1;
}

Assistant:

static Frame*
countCB(Frame *f, void *count)
{
	(*(int32*)count)++;
	f->forAllChildren(countCB, count);
	return f;
}